

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::ExtensionGenerator::GenerateDefinition
          (ExtensionGenerator *this,Printer *printer)

{
  mapped_type *pmVar1;
  FieldDescriptor *pFVar2;
  bool in_CL;
  int i;
  FieldDescriptor *descriptor;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  allocator<char> local_f1;
  string global_name;
  allocator<char> local_c9;
  key_type local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_78;
  string scope;
  string name;
  
  if (*(cxx **)(this->descriptor_ + 0x40) == (cxx *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&scope,"",(allocator<char> *)&vars)
    ;
  }
  else {
    ClassName_abi_cxx11_
              ((string *)&vars,*(cxx **)(this->descriptor_ + 0x40),(Descriptor *)0x0,in_CL);
    std::operator+(&scope,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars
                   ,"::");
    std::__cxx11::string::~string((string *)&vars);
  }
  std::operator+(&name,&scope,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  this->descriptor_);
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (anonymous_namespace)::ExtendeeClassName_abi_cxx11_
            (&global_name,(_anonymous_namespace_ *)this->descriptor_,descriptor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"extendee",(allocator<char> *)&local_78);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&global_name);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&global_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&global_name,"type_traits",(allocator<char> *)&local_c8);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&global_name);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::~string((string *)&global_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&global_name,"name",(allocator<char> *)&local_c8);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&global_name);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::~string((string *)&global_name);
  FieldConstantName_abi_cxx11_(&global_name,(cxx *)this->descriptor_,field);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"constant_name",(allocator<char> *)&local_78);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&global_name);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&global_name);
  DefaultValue_abi_cxx11_(&global_name,(cxx *)this->descriptor_,field_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"default",(allocator<char> *)&local_78);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&global_name);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&global_name);
  SimpleItoa_abi_cxx11_(&global_name,(protobuf *)(ulong)*(uint *)(this->descriptor_ + 0x2c),i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"field_type",(allocator<char> *)&local_78);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_c8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&global_name);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&global_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&global_name,"packed",(allocator<char> *)&local_c8);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&global_name);
  std::__cxx11::string::assign((char *)pmVar1);
  std::__cxx11::string::~string((string *)&global_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&global_name,"scope",(allocator<char> *)&local_c8);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&global_name);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::~string((string *)&global_name);
  pFVar2 = this->descriptor_;
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar2 + 0x2c) * 4) == 9) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"::",&local_f1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"_",&local_c9);
    StringReplace(&global_name,&name,&local_c8,&local_78,true);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"global_name",(allocator<char> *)&local_78);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_c8);
    std::__cxx11::string::_M_assign((string *)pmVar1);
    std::__cxx11::string::~string((string *)&local_c8);
    io::Printer::Print(printer,&vars,"const ::std::string $global_name$_default($default$);\n");
    std::operator+(&local_c8,&global_name,"_default");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"default",&local_f1);
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_78);
    std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&global_name);
    pFVar2 = this->descriptor_;
  }
  if (*(long *)(pFVar2 + 0x40) != 0) {
    io::Printer::Print(printer,&vars,"#ifndef _MSC_VER\nconst int $scope$$constant_name$;\n#endif\n"
                      );
  }
  io::Printer::Print(printer,&vars,
                     "::google::protobuf::internal::ExtensionIdentifier< $extendee$,\n    ::google::protobuf::internal::$type_traits$, $field_type$, $packed$ >\n  $name$($constant_name$, $default$);\n"
                    );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&scope);
  return;
}

Assistant:

void ExtensionGenerator::GenerateDefinition(io::Printer* printer) {
  // If this is a class member, it needs to be declared in its class scope.
  string scope = (descriptor_->extension_scope() == NULL) ? "" :
    ClassName(descriptor_->extension_scope(), false) + "::";
  string name = scope + descriptor_->name();

  map<string, string> vars;
  vars["extendee"     ] = ExtendeeClassName(descriptor_);
  vars["type_traits"  ] = type_traits_;
  vars["name"         ] = name;
  vars["constant_name"] = FieldConstantName(descriptor_);
  vars["default"      ] = DefaultValue(descriptor_);
  vars["field_type"   ] = SimpleItoa(static_cast<int>(descriptor_->type()));
  vars["packed"       ] = descriptor_->options().packed() ? "true" : "false";
  vars["scope"        ] = scope;

  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    // We need to declare a global string which will contain the default value.
    // We cannot declare it at class scope because that would require exposing
    // it in the header which would be annoying for other reasons.  So we
    // replace :: with _ in the name and declare it as a global.
    string global_name = StringReplace(name, "::", "_", true);
    vars["global_name"] = global_name;
    printer->Print(vars,
      "const ::std::string $global_name$_default($default$);\n");

    // Update the default to refer to the string global.
    vars["default"] = global_name + "_default";
  }

  // Likewise, class members need to declare the field constant variable.
  if (descriptor_->extension_scope() != NULL) {
    printer->Print(vars,
      "#ifndef _MSC_VER\n"
      "const int $scope$$constant_name$;\n"
      "#endif\n");
  }

  printer->Print(vars,
    "::google::protobuf::internal::ExtensionIdentifier< $extendee$,\n"
    "    ::google::protobuf::internal::$type_traits$, $field_type$, $packed$ >\n"
    "  $name$($constant_name$, $default$);\n");
}